

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

Column * Catch::TextFlow::Spacer(Column *__return_storage_ptr__,size_t spaceWidth)

{
  long *local_40;
  long local_38;
  long local_30 [2];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  (__return_storage_ptr__->m_string)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_string).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_40,local_38 + (long)local_40);
  __return_storage_ptr__->m_width = 0x4f;
  __return_storage_ptr__->m_indent = 0;
  __return_storage_ptr__->m_initialIndent = 0xffffffffffffffff;
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  if (spaceWidth != 0) {
    __return_storage_ptr__->m_width = spaceWidth;
    return __return_storage_ptr__;
  }
  __assert_fail("newWidth > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                ,0x2862,"Column &Catch::TextFlow::Column::width(size_t)");
}

Assistant:

Column Spacer( size_t spaceWidth ) {
            Column ret{ "" };
            ret.width( spaceWidth );
            return ret;
        }